

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall
cmCTestMultiProcessHandler::cmCTestMultiProcessHandler(cmCTestMultiProcessHandler *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  this->_vptr_cmCTestMultiProcessHandler = (_func_int **)&PTR__cmCTestMultiProcessHandler_0094c338;
  p_Var1 = &(this->Tests).
            super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->Tests).
  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Tests).
  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Tests).
  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Tests).
  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header;
  (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->Tests).
  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SortedTests).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->SortedTests).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->SortedTests).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->StopTimePassed = false;
  p_Var2 = &(this->Properties).
            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->Properties).
  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Properties).
  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Properties).
  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->Properties).
  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->Properties).
  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->TestRunningMap)._M_t._M_impl.super__Rb_tree_header;
  (this->TestRunningMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TestRunningMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TestRunningMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->TestRunningMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->TestRunningMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->TestFinishMap)._M_t._M_impl.super__Rb_tree_header;
  (this->TestFinishMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TestFinishMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TestFinishMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->TestFinishMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->TestFinishMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->TestOutput)._M_t._M_impl.super__Rb_tree_header;
  (this->TestOutput)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TestOutput)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TestOutput)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->TestOutput)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->TestOutput)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->LastTestsFailed).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LastTestsFailed).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LastTestsFailed).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var2 = &(this->LockedResources)._M_t._M_impl.super__Rb_tree_header;
  (this->LockedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LockedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LockedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->LockedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header
  ;
  (this->LockedResources)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->AllocatedResources)._M_t._M_impl.super__Rb_tree_header;
  (this->AllocatedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AllocatedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->AllocatedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->AllocatedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->AllocatedResources)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->ResourceAllocationErrors)._M_t._M_impl.super__Rb_tree_header;
  (this->ResourceAllocationErrors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ResourceAllocationErrors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ResourceAllocationErrors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->ResourceAllocationErrors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->ResourceAllocationErrors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->ResourceAllocator).Resources._M_t._M_impl.super__Rb_tree_header;
  (this->ResourceAllocator).Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  (this->ResourceAllocator).Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ResourceAllocator).Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->ResourceAllocator).Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->ResourceAllocator).Resources._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->TestLoadRetryTimer).super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.
  handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->TestLoadRetryTimer).super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.
  handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->RepeatMode = Never;
  this->RepeatCount = 1;
  this->ParallelLevel = 1;
  this->Completed = 0;
  this->RunningCount = 0;
  this->TestLoad = 0;
  this->FakeLoadForTesting = 0;
  cmAffinity::GetProcessorsAvailable();
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::clear(&(this->ProcessorsAvailable)._M_t);
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_60._M_impl.super__Rb_tree_header;
    (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_60._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_60._M_impl.super__Rb_tree_header._M_node_count;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_60);
  this->HaveAffinity = (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  this->HasCycles = false;
  this->SerialTestRunning = false;
  return;
}

Assistant:

cmCTestMultiProcessHandler::cmCTestMultiProcessHandler()
{
  this->ParallelLevel = 1;
  this->TestLoad = 0;
  this->FakeLoadForTesting = 0;
  this->Completed = 0;
  this->RunningCount = 0;
  this->ProcessorsAvailable = cmAffinity::GetProcessorsAvailable();
  this->HaveAffinity = this->ProcessorsAvailable.size();
  this->HasCycles = false;
  this->SerialTestRunning = false;
}